

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDriver.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  void *pvVar2;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  int *__nptr;
  ostream *poVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  pointer pvVar13;
  long *plVar14;
  long *plVar15;
  pointer *ppiVar16;
  long *plVar17;
  ulong uVar18;
  long *plVar19;
  long *plVar20;
  pointer pvVar21;
  _Alloc_hider _Var22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<int> __l_23;
  initializer_list<int> __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_28;
  string validMapName;
  string invalidMapName;
  Map invalidMap;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  invalidBorderData;
  Map validMap;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  validBorderData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidCountryData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidContinentData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validCountryData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validContinentData;
  allocator_type local_4be;
  allocator_type local_4bd;
  allocator_type local_4bc;
  allocator_type local_4bb;
  allocator_type local_4ba;
  allocator_type local_4b9;
  string *local_4b8;
  string *local_4b0;
  string *local_4a8;
  allocator_type local_499;
  long *local_498;
  long local_490;
  long local_488 [2];
  long *local_478;
  long local_470;
  long local_468;
  string *apsStack_460 [3];
  undefined1 local_448 [32];
  pointer *local_428 [2];
  vector<int,_std::allocator<int>_> local_418;
  vector<int,_std::allocator<int>_> local_400;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<int,_std::allocator<int>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  undefined1 local_358 [24];
  undefined1 local_340 [8];
  pointer local_338;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  long local_308 [2];
  Map local_2f8;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  long *local_260 [2];
  long local_250 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  long *local_200 [2];
  long local_1f0 [2];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e0;
  undefined8 local_1c8;
  string local_1c0;
  string local_1a0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_180;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_150;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_498 = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"vTest map","");
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"europe","");
  ppiVar16 = (pointer *)&local_418;
  local_428[0] = ppiVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"2","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_448;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_358,__l,(allocator_type *)&local_240);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"asia","");
  plVar19 = local_388;
  local_398[0] = plVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"4","");
  __l_00._M_len = 2;
  __l_00._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_340,__l_00,(allocator_type *)&local_2a0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_358;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_a8,__l_01,(allocator_type *)&local_120);
  lVar12 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_358 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  lVar12 = -0x40;
  do {
    if (plVar19 != (long *)plVar19[-2]) {
      operator_delete((long *)plVar19[-2],*plVar19 + 1);
    }
    plVar19 = plVar19 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x40;
  do {
    if ((vector<int,_std::allocator<int>_> *)ppiVar16 !=
        (vector<int,_std::allocator<int>_> *)((_Vector_impl_data *)(ppiVar16 + -2))->_M_start) {
      operator_delete((vector<int,_std::allocator<int>_> *)
                      ((_Vector_impl_data *)(ppiVar16 + -2))->_M_start,(long)*ppiVar16 + 1);
    }
    ppiVar16 = ppiVar16 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"1","");
  plVar19 = local_388;
  local_398[0] = plVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"france","");
  local_4b8 = (string *)local_378;
  plVar14 = local_368;
  local_378[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>(local_4b8,"1","");
  __l_02._M_len = 3;
  __l_02._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_448,__l_02,(allocator_type *)&local_120);
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"2","");
  local_338 = (pointer)local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_340 + 8),"germany","");
  local_4a8 = (string *)(local_328 + 0x10);
  plVar17 = local_308;
  local_318._M_allocated_capacity = (size_type)plVar17;
  std::__cxx11::string::_M_construct<char_const*>(local_4a8,"1","");
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_448 + 0x18),__l_03,(allocator_type *)&local_90);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"3","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"russia","");
  local_4b0 = (string *)local_200;
  plVar20 = local_1f0;
  local_200[0] = plVar20;
  std::__cxx11::string::_M_construct<char_const*>(local_4b0,"2","");
  __l_04._M_len = 3;
  __l_04._M_array = &local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_418,__l_04,(allocator_type *)&local_478);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"4","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"dawd","");
  plVar15 = local_250;
  local_260[0] = plVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"2","");
  __l_05._M_len = 3;
  __l_05._M_array = &local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l_05,(allocator_type *)&local_1e0);
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)local_448;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_150,__l_06,(allocator_type *)&local_2f8);
  lVar12 = 0x48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  lVar12 = -0x60;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_240._M_dataplus._M_p = (pointer)0x200000001;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_240;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_448,__l_07,(allocator_type *)&local_120);
  local_3b8._M_dataplus._M_p = (pointer)0x100000002;
  local_3b8._M_string_length._0_4_ = 3;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&local_3b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_448 + 0x18),__l_08,
             (allocator_type *)&local_90);
  local_4b8 = (string *)local_358;
  local_358._0_8_ = (pointer)0x200000003;
  local_358._8_4_ = 4;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_4b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_418,__l_09,(allocator_type *)&local_478);
  local_2a0._M_dataplus._M_p = (pointer)0x300000004;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_2a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_400,__l_10,(allocator_type *)&local_2f8);
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)local_448;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1e0,__l_11,(allocator_type *)&local_168);
  lVar12 = 0x60;
  do {
    pvVar2 = *(void **)((long)apsStack_460 + lVar12);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)(local_448 + lVar12 + -8) - (long)pvVar2);
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_498,local_490 + (long)local_498);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_c0,&local_a8);
  Map::Map(&local_2f8,&local_1a0,&local_c0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar7 = __errno_location();
    pvVar21 = local_150.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      __nptr = (int *)(((pvVar21->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      iVar1 = *piVar7;
      *piVar7 = 0;
      lVar12 = strtol((char *)__nptr,(char **)local_448,10);
      if ((int *)local_448._0_8_ == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00103838:
        std::__throw_out_of_range("stoi");
LAB_00103844:
        std::__throw_invalid_argument("stoi");
LAB_00103850:
        std::__throw_out_of_range("stoi");
        goto LAB_0010385c;
      }
      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_00103838;
      if (*piVar7 == 0) {
        *piVar7 = iVar1;
      }
      pbVar3 = (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      pcVar4 = pbVar3[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,pcVar4,pcVar4 + pbVar3[1]._M_string_length);
      __nptr = (int *)(pvVar21->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      iVar1 = *piVar7;
      *piVar7 = 0;
      lVar8 = strtol((char *)__nptr,(char **)local_448,10);
      if ((int *)local_448._0_8_ == __nptr) goto LAB_00103844;
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_00103850;
      if (*piVar7 == 0) {
        *piVar7 = iVar1;
      }
      Map::addNode(&local_2f8,(int)lVar12,&local_2e0,(int)lVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      pvVar21 = pvVar21 + 1;
    } while (pvVar21 !=
             local_150.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar13 = local_1e0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      piVar7 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (4 < (ulong)((long)(pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar7)) {
        uVar11 = 1;
        uVar18 = 2;
        do {
          Map::addEdge(&local_2f8,*piVar7,piVar7[uVar11]);
          piVar7 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = uVar18 < (ulong)((long)(pvVar13->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >>
                                  2);
          uVar11 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar5);
      }
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 !=
             local_1e0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_478 = &local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"vTest map","");
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"europe","");
  ppiVar16 = (pointer *)&local_418;
  local_428[0] = ppiVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"2","");
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_448;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_358,__l_12,(allocator_type *)&local_240);
  local_4b8 = (string *)local_340;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"asia","");
  local_398[0] = plVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"4","");
  __l_13._M_len = 2;
  __l_13._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_340,__l_13,(allocator_type *)&local_2a0);
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_358;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_168,__l_14,(allocator_type *)&local_120);
  lVar12 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_358 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  lVar12 = -0x40;
  do {
    if (plVar19 != (long *)plVar19[-2]) {
      operator_delete((long *)plVar19[-2],*plVar19 + 1);
    }
    plVar19 = plVar19 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x40;
  do {
    if (ppiVar16 != (pointer *)((_Vector_impl_data *)(ppiVar16 + -2))->_M_start) {
      operator_delete(((_Vector_impl_data *)(ppiVar16 + -2))->_M_start,(long)*ppiVar16 + 1);
    }
    ppiVar16 = ppiVar16 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"1","");
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"france","");
  local_4b8 = (string *)local_378;
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>(local_4b8,"1","");
  __l_15._M_len = 3;
  __l_15._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_448,__l_15,(allocator_type *)&local_1c8);
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"2","");
  local_338 = (pointer)local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_340 + 8),"germany","");
  local_4a8 = (string *)(local_328 + 0x10);
  plVar19 = local_308;
  local_318._M_allocated_capacity = (size_type)plVar19;
  std::__cxx11::string::_M_construct<char_const*>(local_4a8,"1","");
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_448 + 0x18),__l_16,&local_4b9);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"3","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"russia","");
  local_4b0 = (string *)local_200;
  plVar14 = local_1f0;
  local_200[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>(local_4b0,"2","");
  __l_17._M_len = 3;
  __l_17._M_array = &local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_418,__l_17,&local_4ba);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"4","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"kongo","");
  plVar17 = local_250;
  local_260[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"1","");
  __l_18._M_len = 3;
  __l_18._M_array = &local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l_18,&local_4bb);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"5","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"lebanon","");
  apsStack_460[2] = (string *)local_e0;
  plVar20 = local_d0;
  local_e0[0] = plVar20;
  std::__cxx11::string::_M_construct<char_const*>(apsStack_460[2],"2","");
  __l_19._M_len = 3;
  __l_19._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_3e8,__l_19,&local_4bc);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"6","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"nepal","");
  apsStack_460[1] = (string *)local_50;
  plVar15 = local_40;
  local_50[0] = plVar15;
  std::__cxx11::string::_M_construct<char_const*>(apsStack_460[1],"2","");
  __l_20._M_len = 3;
  __l_20._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_3d0,__l_20,&local_4bd);
  __l_21._M_len = 6;
  __l_21._M_array = (iterator)local_448;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_180,__l_21,&local_4be);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  lVar12 = -0x60;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  plVar20 = local_368;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar19 != (long *)plVar19[-2]) {
      operator_delete((long *)plVar19[-2],*plVar19 + 1);
    }
    plVar19 = plVar19 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  lVar12 = -0x60;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_358._0_8_ = (pointer)0x200000001;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)local_358;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_448,__l_22,(allocator_type *)&local_4b9);
  local_240._M_dataplus._M_p = (pointer)0x300000002;
  __l_23._M_len = 2;
  __l_23._M_array = (iterator)&local_240;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_448 + 0x18),__l_23,
             (allocator_type *)&local_4ba);
  local_2a0._M_dataplus._M_p = (pointer)0x100000003;
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)&local_2a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_418,__l_24,(allocator_type *)&local_4bb);
  local_120._M_dataplus._M_p = (pointer)0x500000004;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_120;
  std::vector<int,_std::allocator<int>_>::vector(&local_400,__l_25,(allocator_type *)&local_4bc);
  local_90._M_dataplus._M_p = (pointer)0x600000005;
  __l_26._M_len = 2;
  __l_26._M_array = (iterator)&local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,__l_26,(allocator_type *)&local_4bd);
  local_1c8 = 0x400000006;
  __l_27._M_len = 2;
  __l_27._M_array = (iterator)&local_1c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_3d0,__l_27,(allocator_type *)&local_4be);
  __l_28._M_len = 6;
  __l_28._M_array = (iterator)local_448;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_3b8,__l_28,&local_499);
  lVar12 = 0x90;
  do {
    pvVar2 = *(void **)((long)apsStack_460 + lVar12);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)(local_448 + lVar12 + -8) - (long)pvVar2);
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_478,local_470 + (long)local_478);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_138,&local_168);
  Map::Map((Map *)local_448,&local_1c0,&local_138);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_180.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __nptr = __errno_location();
    pvVar21 = local_180.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar3 = (pointer)(((pvVar21->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      iVar1 = *__nptr;
      *__nptr = 0;
      lVar12 = strtol((char *)pbVar3,(char **)local_358,10);
      if ((pointer)local_358._0_8_ == pbVar3) {
LAB_0010385c:
        std::__throw_invalid_argument("stoi");
LAB_00103868:
        std::__throw_out_of_range("stoi");
LAB_00103874:
        std::__throw_invalid_argument("stoi");
LAB_00103880:
        uVar10 = std::__throw_out_of_range("stoi");
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_138);
        if ((int *)local_1c0._M_dataplus._M_p != __nptr) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_3b8);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_180);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_168);
        if (local_478 != &local_468) {
          operator_delete(local_478,local_468 + 1);
        }
        Map::~Map(&local_2f8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_1e0);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_150);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_a8);
        if (local_498 != local_488) {
          operator_delete(local_498,local_488[0] + 1);
        }
        _Unwind_Resume(uVar10);
      }
      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*__nptr == 0x22)) goto LAB_00103868;
      if (*__nptr == 0) {
        *__nptr = iVar1;
      }
      pbVar3 = (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      pcVar4 = pbVar3[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar4,pcVar4 + pbVar3[1]._M_string_length);
      pbVar3 = (pointer)(pvVar21->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      iVar1 = *__nptr;
      *__nptr = 0;
      lVar8 = strtol((char *)pbVar3,(char **)local_358,10);
      if ((pointer)local_358._0_8_ == pbVar3) goto LAB_00103874;
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*__nptr == 0x22)) goto LAB_00103880;
      if (*__nptr == 0) {
        *__nptr = iVar1;
      }
      Map::addNode((Map *)local_448,(int)lVar12,&local_2c0,(int)lVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pvVar21 = pvVar21 + 1;
    } while (pvVar21 !=
             local_180.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar6 = (char *)CONCAT44(local_3b8._M_string_length._4_4_,(undefined4)local_3b8._M_string_length)
  ;
  if (local_3b8._M_dataplus._M_p != pcVar6) {
    _Var22._M_p = local_3b8._M_dataplus._M_p;
    do {
      piVar7 = *(int **)_Var22._M_p;
      if (4 < (ulong)(*(long *)(_Var22._M_p + 8) - (long)piVar7)) {
        uVar11 = 1;
        uVar18 = 2;
        do {
          Map::addEdge((Map *)local_448,*piVar7,piVar7[uVar11]);
          piVar7 = *(int **)_Var22._M_p;
          bVar5 = uVar18 < (ulong)(*(long *)(_Var22._M_p + 8) - (long)piVar7 >> 2);
          uVar11 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar5);
      }
      _Var22._M_p = _Var22._M_p + 0x18;
    } while (_Var22._M_p != pcVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing valid map...\n Connected : ",0x22);
  Map::testConnected(&local_2f8);
  poVar9 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing invalid map...\n Connected : ",0x24);
  Map::testConnected((Map *)local_448);
  poVar9 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  Map::~Map((Map *)local_448);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_3b8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_168);
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  Map::~Map(&local_2f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1e0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_150);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_a8);
  if (local_498 != local_488) {
    operator_delete(local_498,local_488[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    //more extensive tests are performed in the MapLoader (on the data being submitted)

    //declare valid map information
    std::string validMapName = "vTest map";
    std::vector<std::vector<std::string>> validContinentData = {{"europe", "2"},
                                                                {"asia",   "4"}};
    std::vector<std::vector<std::string>> validCountryData = {{"1", "france",  "1"},
                                                              {"2", "germany", "1"},
                                                              {"3", "russia",  "2"},
                                                              {"4","dawd", "2"}};
    std::vector<std::vector<int>> validBorderData = {{1, 2},
                                                     {2, 1, 3},
                                                     {3, 2, 4},
                                                     {4, 3}};
    //create map object with empty continents
    Map validMap = Map(validMapName, validContinentData);
    //add countries to map and continents
    for (auto& i : validCountryData) {
        validMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : validBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            validMap.addEdge(i[0], i[j]);
        }
    }

    //declare invalid map information
    std::string invalidMapName = "vTest map";
    std::vector<std::vector<std::string>> invalidContinentData = {{"europe", "2"},
                                                                  {"asia",   "4"}};
    std::vector<std::vector<std::string>> invalidCountryData = {{"1", "france",  "1"},
                                                                {"2", "germany", "1"},
                                                                {"3", "russia",  "2"},
                                                                {"4", "kongo",  "1"},
                                                                {"5", "lebanon",  "2"},
                                                                {"6", "nepal",  "2"}};
    std::vector<std::vector<int>> invalidBorderData = {{1, 2},
                                                       {2, 3},
                                                       {3, 1},
                                                       {4,5},
                                                       {5,6},
                                                       {6,4}};
    //create map object with empty continents
    Map invalidMap = Map(invalidMapName, invalidContinentData);
    //add countries to map and continents
    for (auto& i : invalidCountryData) {
        invalidMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : invalidBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            invalidMap.addEdge(i[0], i[j]);
        }
    }

    //test maps
//    validMap.printMap();
//    invalidMap.printMap();
    std::cout << "Testing valid map...\n Connected : " << validMap.testConnected() << "\n";
    std::cout << "Testing invalid map...\n Connected : " << invalidMap.testConnected() << "\n";
    return 0;
}